

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_ffh_tostring(lua_State *L)

{
  uint64_t uVar1;
  int iVar2;
  TValue *o;
  cTValue *pcVar3;
  GCstr *pGVar4;
  
  o = lj_lib_checkany(L,1);
  L->top = o + 1;
  pcVar3 = lj_meta_lookup(L,o,MM_tostring);
  if (pcVar3->u64 == 0xffffffffffffffff) {
    uVar1 = (L->glref).ptr64;
    if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
      lj_gc_step(L);
    }
    pcVar3 = L->base;
    pGVar4 = lj_strfmt_obj(L,pcVar3);
    pcVar3[-2].u64 = (ulong)pGVar4 | 0xfffd800000000000;
    iVar2 = 2;
  }
  else {
    L->base[-2] = (TValue)pcVar3->u64;
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

LJLIB_ASM(tostring)		LJLIB_REC(.)
{
  TValue *o = lj_lib_checkany(L, 1);
  cTValue *mo;
  L->top = o+1;  /* Only keep one argument. */
  if (!tvisnil(mo = lj_meta_lookup(L, o, MM_tostring))) {
    copyTV(L, L->base-1-LJ_FR2, mo);  /* Replace callable. */
    return FFH_TAILCALL;
  }
  lj_gc_check(L);
  setstrV(L, L->base-1-LJ_FR2, lj_strfmt_obj(L, L->base));
  return FFH_RES(1);
}